

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

bool __thiscall Assimp::ColladaParser::ReadBoolFromTextContent(ColladaParser *this)

{
  int iVar1;
  char *s1;
  bool local_19;
  char *cur;
  ColladaParser *this_local;
  
  s1 = GetTextContent(this);
  iVar1 = ASSIMP_strincmp(s1,"true",4);
  local_19 = true;
  if (iVar1 != 0) {
    local_19 = *s1 != '0';
  }
  return local_19;
}

Assistant:

bool ColladaParser::ReadBoolFromTextContent()
{
    const char* cur = GetTextContent();
    return (!ASSIMP_strincmp(cur, "true", 4) || '0' != *cur);
}